

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O1

event_queue_t * __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
::bind_agent_with_cooperation_fifo
          (dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
           *this,agent_ref_t *agent,bind_params_t *params)

{
  stats_supplier_t *psVar1;
  _func_int **pp_Var2;
  anon_class_16_2_515617ac rollback_action;
  anon_class_24_3_386d7799 main_action;
  string *psVar3;
  iterator iVar4;
  string *coop_name;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>_>,_bool>
  pVar5;
  iterator it;
  dispatcher_t local_68;
  _Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false> in_stack_ffffffffffffffa8;
  
  psVar3 = agent_t::so_coop_name_abi_cxx11_(agent->m_obj);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>_>_>
          ::find(&(this->m_cooperations)._M_t,psVar3);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->m_cooperations)._M_t._M_impl.super__Rb_tree_header
     ) {
    psVar3 = agent_t::so_coop_name_abi_cxx11_(agent->m_obj);
    make_new_agent_queue
              ((dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
                *)&stack0xffffffffffffff98,(bind_params_t *)this);
    coop_name = agent_t::so_coop_name_abi_cxx11_(agent->m_obj);
    cooperation_data_t::cooperation_data_t
              ((cooperation_data_t *)&stack0xffffffffffffffa8,
               (agent_queue_ref_t *)&stack0xffffffffffffff98,1,&(this->m_data_source).m_prefix,
               coop_name);
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>,std::_Select1st<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>>>
            ::
            _M_emplace_unique<std::__cxx11::string_const&,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>,std::_Select1st<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>>>
                        *)&this->m_cooperations,psVar3,
                       (cooperation_data_t *)&stack0xffffffffffffffa8);
    iVar4._M_node = (_Base_ptr)pVar5.first._M_node;
    intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
    dismiss_object((intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>
                    *)&stack0xffffffffffffffb8);
    if ((dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
         *)in_stack_ffffffffffffffa8._M_head_impl !=
        (dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
         *)0x0) {
      LOCK();
      psVar1 = (stats_supplier_t *)(in_stack_ffffffffffffffa8._M_head_impl + 1);
      psVar1->_vptr_stats_supplier_t = (_func_int **)((long)psVar1->_vptr_stats_supplier_t + -1);
      UNLOCK();
      if ((psVar1->_vptr_stats_supplier_t == (_func_int **)0x0) &&
         ((dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
           *)in_stack_ffffffffffffffa8._M_head_impl !=
          (dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
           *)0x0)) {
        (*(((ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t> *)
           &(in_stack_ffffffffffffffa8._M_head_impl)->_vptr_lock_t)->super_dispatcher_t).
          _vptr_dispatcher_t[1])();
      }
      in_stack_ffffffffffffffa8._M_head_impl = (lock_t *)0x0;
    }
    if (local_68._vptr_dispatcher_t != (_func_int **)0x0) {
      LOCK();
      pp_Var2 = local_68._vptr_dispatcher_t + 1;
      *pp_Var2 = *pp_Var2 + -1;
      UNLOCK();
      if ((*pp_Var2 == (_func_int *)0x0) && (local_68._vptr_dispatcher_t != (_func_int **)0x0)) {
        (**(code **)(*local_68._vptr_dispatcher_t + 8))();
      }
      local_68._vptr_dispatcher_t = (_func_int **)0x0;
    }
  }
  else {
    iVar4._M_node[2]._M_parent = (_Base_ptr)((long)&(iVar4._M_node[2]._M_parent)->_M_color + 1);
  }
  main_action.agent = agent;
  main_action.this = this;
  main_action.it = (iterator *)&stack0xffffffffffffffa0;
  rollback_action.this =
       (dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
        *)in_stack_ffffffffffffffa8._M_head_impl;
  rollback_action.it = (iterator *)iVar4._M_node;
  details::
  do_with_rollback_on_exception<so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::bind_agent_with_cooperation_fifo(so_5::intrusive_ptr_t<so_5::agent_t>,so_5::disp::adv_thread_pool::bind_params_t_const&)::_lambda()_1_,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::bind_agent_with_cooperation_fifo(so_5::intrusive_ptr_t<so_5::agent_t>,so_5::disp::adv_thread_pool::bind_params_t_const&)::_lambda()_2_>
            (main_action,rollback_action);
  return (event_queue_t *)iVar4._M_node[2];
}

Assistant:

event_queue_t *
		bind_agent_with_cooperation_fifo(
			agent_ref_t agent,
			const PARAMS & params )
			{
				auto it = m_cooperations.find( agent->so_coop_name() );
				if( it == m_cooperations.end() )
					it = m_cooperations.emplace(
							agent->so_coop_name(),
							cooperation_data_t(
									make_new_agent_queue( params ),
									1,
									m_data_source.prefix(),
									agent->so_coop_name() ) )
							.first;
				else
					it->second.m_agents += 1;

				so_5::details::do_with_rollback_on_exception(
						[&] {
							m_agents.emplace(
									agent.get(),
									agent_data_t{ it->second.m_queue } );
						},
						[&] {
							// Rollback m_cooperations modification.
							if( 0 == --(it->second.m_agents) )
								m_cooperations.erase( it );
						} );

				return it->second.m_queue.get();
			}